

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_br89.c
# Opt level: O0

double br89_x_Q(double x,void *_rhs)

{
  double dVar1;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double eee;
  double arg;
  double xm2;
  double rhs;
  undefined8 local_40;
  
  dVar1 = *in_RDI;
  dVar2 = (in_XMM0_Qa * 2.0) / 3.0;
  dVar3 = log(1e+50);
  if (dVar2 <= dVar3) {
    local_40 = exp(-dVar2);
  }
  else {
    local_40 = 0.0;
  }
  return in_XMM0_Qa * local_40 + -(dVar1 * (in_XMM0_Qa - 2.0));
}

Assistant:

GPU_FUNCTION static double
br89_x_Q(double x, void *_rhs)
{
  double rhs, xm2, arg, eee;
  rhs = *((double *)_rhs);

  xm2 = x - 2.0;
  arg = 2.0*x/3.0;
  eee = arg > log(1e50) ? 0 : exp(-arg);

  return x*eee - rhs*xm2;
}